

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modifiers.cpp
# Opt level: O3

void __thiscall
EnumerationParse_SetC_Test::~EnumerationParse_SetC_Test(EnumerationParse_SetC_Test *this)

{
  anon_unknown.dwarf_e61f9::EnumerationParse::~EnumerationParse(&this->super_EnumerationParse);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (EnumerationParse, SetC) {
    opt<enumeration> enum_opt{
        "enumeration", values (literal{"a", static_cast<int> (enumeration::a), "a description"},
                               literal{"b", static_cast<int> (enumeration::b), "b description"},
                               literal{"c", static_cast<int> (enumeration::c), "c description"})};

    std::vector<std::string> argv{"progname", "--enumeration=c"};
    string_stream output;
    string_stream errors;
    bool ok = details::parse_command_line_options (std::begin (argv), std::end (argv), "overview",
                                                   output, errors);
    ASSERT_TRUE (ok);
    ASSERT_EQ (enum_opt.get (), enumeration::c);
}